

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileInfo.cpp
# Opt level: O0

void __thiscall
Js::DynamicProfileInfo::RecordCallSiteInfo
          (DynamicProfileInfo *this,FunctionBody *functionBody,ProfileId callSiteId,
          FunctionInfo *calleeFunctionInfo,JavascriptFunction *calleeFunction,uint actualArgCount,
          bool isConstructorCall,InlineCacheIndex ldFldInlineCacheId)

{
  code *pcVar1;
  ushort uVar2;
  bool bVar3;
  byte bVar4;
  FunctionBody **ppFVar5;
  FunctionBody *pFVar6;
  CallSiteInfo **ppCVar7;
  undefined4 *puVar8;
  LocalFunctionId local_64;
  SourceId local_60;
  LocalFunctionId functionId;
  SourceId sourceId;
  LocalFunctionId oldFunctionId;
  byte local_4d;
  SourceId oldSourceId;
  bool doInline;
  AutoCriticalSection local_40;
  AutoCriticalSection cs;
  bool isConstructorCall_local;
  uint actualArgCount_local;
  JavascriptFunction *calleeFunction_local;
  FunctionInfo *calleeFunctionInfo_local;
  ProfileId callSiteId_local;
  FunctionBody *functionBody_local;
  DynamicProfileInfo *this_local;
  
  cs.cs._3_1_ = isConstructorCall;
  cs.cs._4_4_ = actualArgCount;
  AutoCriticalSection::AutoCriticalSection(&local_40,(CriticalSection *)callSiteInfoCS);
  bVar3 = NeedProfileInfoList();
  if (((bVar3) && ((this->persistsAcrossScriptContexts & 1U) == 0)) &&
     (ppFVar5 = Memory::WriteBarrierPtr::operator_cast_to_FunctionBody__
                          ((WriteBarrierPtr *)&this->functionBody), *ppFVar5 != functionBody)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                                ,0x2c2,
                                "(!DynamicProfileInfo::NeedProfileInfoList() || this->persistsAcrossScriptContexts || this->functionBody == functionBody)"
                                ,
                                "!DynamicProfileInfo::NeedProfileInfoList() || this->persistsAcrossScriptContexts || this->functionBody == functionBody"
                               );
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  local_4d = cs.cs._4_4_ < 0x10;
  if (((calleeFunctionInfo != (FunctionInfo *)0x0) &&
      (pFVar6 = (FunctionBody *)FunctionInfo::GetFunctionProxy(calleeFunctionInfo),
      functionBody == pFVar6)) && (callSiteId < 0x20)) {
    this->m_recursiveInlineInfo = this->m_recursiveInlineInfo | 1 << ((byte)callSiteId & 0x1f);
  }
  ppCVar7 = Memory::WriteBarrierPtr::operator_cast_to_CallSiteInfo__
                      ((WriteBarrierPtr *)&this->callSiteInfo);
  if (*(short *)&(*ppCVar7)[callSiteId].field_0x2 < 0) {
    if ((local_4d & 1) == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                                  ,0x2fb,"(doInline)","doInline");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
    ppCVar7 = Memory::WriteBarrierPtr::operator_cast_to_CallSiteInfo__
                        ((WriteBarrierPtr *)&this->callSiteInfo);
    if ((*(ushort *)&(*ppCVar7)[callSiteId].field_0x2 >> 0xd & 1) != (ushort)(cs.cs._3_1_ & 1)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                                  ,0x2fc,
                                  "(callSiteInfo[callSiteId].isConstructorCall == isConstructorCall)"
                                  ,"callSiteInfo[callSiteId].isConstructorCall == isConstructorCall"
                                 );
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
    RecordPolymorphicCallSiteInfo(this,functionBody,callSiteId,calleeFunctionInfo);
  }
  else {
    ppCVar7 = Memory::WriteBarrierPtr::operator_cast_to_CallSiteInfo__
                        ((WriteBarrierPtr *)&this->callSiteInfo);
    oldFunctionId = (*ppCVar7)[callSiteId].u.functionData.sourceId;
    if (oldFunctionId != 0xfffffffc) {
      ppCVar7 = Memory::WriteBarrierPtr::operator_cast_to_CallSiteInfo__
                          ((WriteBarrierPtr *)&this->callSiteInfo);
      functionId = (*ppCVar7)[callSiteId].u.functionData.functionId;
      GetSourceAndFunctionId(functionBody,calleeFunctionInfo,calleeFunction,&local_60,&local_64);
      if (oldFunctionId == 0xffffffff) {
        ppCVar7 = Memory::WriteBarrierPtr::operator_cast_to_CallSiteInfo__
                            ((WriteBarrierPtr *)&this->callSiteInfo);
        (*ppCVar7)[callSiteId].u.functionData.sourceId = local_60;
        ppCVar7 = Memory::WriteBarrierPtr::operator_cast_to_CallSiteInfo__
                            ((WriteBarrierPtr *)&this->callSiteInfo);
        (*ppCVar7)[callSiteId].u.functionData.functionId = local_64;
        this->currentInlinerVersion = this->currentInlinerVersion + '\x01';
      }
      else if ((oldFunctionId != local_60) || (functionId != local_64)) {
        if (functionId != 0xffffffff) {
          this->currentInlinerVersion = this->currentInlinerVersion + '\x01';
        }
        if (((local_4d & 1) == 0) ||
           (bVar3 = IsPolymorphicCallSite(this,local_64,local_60,functionId,oldFunctionId), !bVar3))
        {
          ppCVar7 = Memory::WriteBarrierPtr::operator_cast_to_CallSiteInfo__
                              ((WriteBarrierPtr *)&this->callSiteInfo);
          (*ppCVar7)[callSiteId].u.functionData.functionId = 0xffffffff;
        }
        else {
          CreatePolymorphicDynamicProfileCallSiteInfo
                    (this,functionBody,callSiteId,local_64,functionId,local_60,oldFunctionId);
        }
      }
      uVar2 = (ushort)cs.cs._3_1_;
      ppCVar7 = Memory::WriteBarrierPtr::operator_cast_to_CallSiteInfo__
                          ((WriteBarrierPtr *)&this->callSiteInfo);
      *(ushort *)&(*ppCVar7)[callSiteId].field_0x2 =
           *(ushort *)&(*ppCVar7)[callSiteId].field_0x2 & 0xdfff | (uVar2 & 1) << 0xd;
      bVar4 = ~local_4d;
      ppCVar7 = Memory::WriteBarrierPtr::operator_cast_to_CallSiteInfo__
                          ((WriteBarrierPtr *)&this->callSiteInfo);
      *(ushort *)&(*ppCVar7)[callSiteId].field_0x2 =
           *(ushort *)&(*ppCVar7)[callSiteId].field_0x2 & 0xbfff | (bVar4 & 1) << 0xe;
      ppCVar7 = Memory::WriteBarrierPtr::operator_cast_to_CallSiteInfo__
                          ((WriteBarrierPtr *)&this->callSiteInfo);
      (*ppCVar7)[callSiteId].ldFldInlineCacheId = ldFldInlineCacheId;
    }
  }
  sourceId = 1;
  AutoCriticalSection::~AutoCriticalSection(&local_40);
  return;
}

Assistant:

void DynamicProfileInfo::RecordCallSiteInfo(FunctionBody* functionBody, ProfileId callSiteId, FunctionInfo* calleeFunctionInfo, JavascriptFunction* calleeFunction, uint actualArgCount, bool isConstructorCall, InlineCacheIndex ldFldInlineCacheId)
    {
        AutoCriticalSection cs(&this->callSiteInfoCS);

#if DBG_DUMP || defined(DYNAMIC_PROFILE_STORAGE) || defined(RUNTIME_DATA_COLLECTION)
        // If we persistsAcrossScriptContext, the dynamic profile info may be referred to by multiple function body from
        // different script context
        Assert(!DynamicProfileInfo::NeedProfileInfoList() || this->persistsAcrossScriptContexts || this->functionBody == functionBody);
#endif
        bool doInline = true;
        // This is a hard limit as we only use 4 bits to encode the actual count in the InlineeCallInfo
        if (actualArgCount > Js::InlineeCallInfo::MaxInlineeArgoutCount)
        {
            doInline = false;
        }

        // Mark the callsite bit where caller and callee is same function
        if (calleeFunctionInfo && functionBody == calleeFunctionInfo->GetFunctionProxy() && callSiteId < 32)
        {
            this->m_recursiveInlineInfo = this->m_recursiveInlineInfo | (1 << callSiteId);
        }

        if (!callSiteInfo[callSiteId].isPolymorphic)
        {
            Js::SourceId oldSourceId = callSiteInfo[callSiteId].u.functionData.sourceId;
            if (oldSourceId == InvalidSourceId)
            {
                return;
            }

            Js::LocalFunctionId oldFunctionId = callSiteInfo[callSiteId].u.functionData.functionId;

            Js::SourceId sourceId;
            Js::LocalFunctionId functionId;
            GetSourceAndFunctionId(functionBody, calleeFunctionInfo, calleeFunction, &sourceId, &functionId);

            if (oldSourceId == NoSourceId)
            {
                callSiteInfo[callSiteId].u.functionData.sourceId = sourceId;
                callSiteInfo[callSiteId].u.functionData.functionId = functionId;
                this->currentInlinerVersion++; // we don't mind if this overflows
            }
            else if (oldSourceId != sourceId || oldFunctionId != functionId)
            {
                if (oldFunctionId != CallSiteMixed)
                {
                    this->currentInlinerVersion++; // we don't mind if this overflows
                }

                if (doInline && IsPolymorphicCallSite(functionId, sourceId, oldFunctionId, oldSourceId))
                {
                    CreatePolymorphicDynamicProfileCallSiteInfo(functionBody, callSiteId, functionId, oldFunctionId, sourceId, oldSourceId);
                }
                else
                {
                    callSiteInfo[callSiteId].u.functionData.functionId = CallSiteMixed;
                }
            }
            callSiteInfo[callSiteId].isConstructorCall = isConstructorCall;
            callSiteInfo[callSiteId].dontInline = !doInline;
            callSiteInfo[callSiteId].ldFldInlineCacheId = ldFldInlineCacheId;
        }
        else
        {
            Assert(doInline);
            Assert(callSiteInfo[callSiteId].isConstructorCall == isConstructorCall);
            RecordPolymorphicCallSiteInfo(functionBody, callSiteId, calleeFunctionInfo);
        }

        return;
    }